

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcDistributionPort::IfcDistributionPort(IfcDistributionPort *this)

{
  *(undefined ***)&this->field_0x148 = &PTR__Object_00836880;
  *(undefined8 *)&this->field_0x150 = 0;
  *(char **)&this->field_0x158 = "IfcDistributionPort";
  IfcPort::IfcPort((IfcPort *)this,&PTR_construction_vtable_24__008efea0);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionPort,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x8efd98;
  *(undefined8 *)&this->field_0x148 = 0x8efe88;
  *(undefined8 *)&this->field_0x88 = 0x8efdc0;
  *(undefined8 *)&this->field_0x98 = 0x8efde8;
  *(undefined8 *)&this->field_0xd0 = 0x8efe10;
  *(undefined8 *)&this->field_0x100 = 0x8efe38;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionPort,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x8efe60;
  *(undefined1 **)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionPort,_1UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionPort,_1UL>).field_0x20;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionPort,_1UL>).field_0x18 = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcDistributionPort,_1UL>).field_0x20 = 0;
  this->field_0x140 = 0;
  return;
}

Assistant:

IfcDistributionPort() : Object("IfcDistributionPort") {}